

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O1

double __thiscall llvm::ECError::log(ECError *this,double __x)

{
  error_category *peVar1;
  size_t in_RCX;
  raw_ostream *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  long *local_38;
  void *local_30;
  long local_28 [2];
  
  peVar1 = (this->EC)._M_cat;
  (**(code **)(*(long *)peVar1 + 0x20))(&local_38,peVar1,(this->EC)._M_value);
  raw_ostream::write(in_RSI,(int)local_38,local_30,in_RCX);
  dVar2 = extraout_XMM0_Qa;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

void log(raw_ostream &OS) const override { OS << EC.message(); }